

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O0

int __thiscall
Lib::
DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
::remove(DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
         *this,char *__filename)

{
  TermSpec TVar1;
  Entry *e;
  int iVar2;
  DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
  *pDVar3;
  TermSpec local_50;
  TermList local_40;
  pair<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::TermSpec>
  local_38;
  Entry *local_20;
  char *local_10;
  DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
  *local_8;
  
  pDVar3 = this;
  local_10 = __filename;
  local_8 = this;
  local_20 = findEntry(this,(TermList *)this);
  iVar2 = (int)pDVar3;
  if (local_20 == (Entry *)0x0) {
    memset(this,0,0x20);
    Option<std::pair<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::TermSpec>_>
    ::Option((Option<std::pair<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::TermSpec>_>
              *)0x449209);
  }
  else {
    (local_20->field_0)._infoData = (local_20->field_0)._infoData & 0xfffffffeU | 1;
    *(int *)(__filename + 4) = *(int *)(__filename + 4) + -1;
    *(int *)(__filename + 8) = *(int *)(__filename + 8) + 1;
    local_40 = move_if_value<Kernel::TermList,_true>(&local_20->_key);
    TVar1 = move_if_value<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::TermSpec,_true>
                      (&local_20->_val);
    local_50.t = TVar1.t._content;
    local_50.q = TVar1.q;
    std::
    pair<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::TermSpec>
    ::
    pair<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::TermSpec,_true>
              (&local_38,&local_40,&local_50);
    some<std::pair<Kernel::TermList,Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::TermSpec>>
              ((pair<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::TermSpec>
                *)this);
  }
  return iVar2;
}

Assistant:

Option<std::pair<Key,Val>> remove(Key const& key)
  {
    Entry* e=findEntry(key);
    if(!e) {
      return {};
    }
    e->_info.deleted=1;
    _size--;
    _deleted++;
    return some(std::pair<Key,Val>(move_if_value<Key>(e->_key), move_if_value<Val>(e->_val)));
  }